

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O2

bool QBenchmarkValgrindUtils::haveValgrind(void)

{
  char cVar1;
  undefined1 uVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<QString> local_58;
  QArrayDataPointer<char16_t> local_40;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_28,(QObject *)0x0);
  Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"valgrind",8);
  Qt::Literals::StringLiterals::operator____s((QString *)&local_70,L"--version",9);
  QList<QString>::QList<QString,void>((QList<QString> *)&local_58,(QString *)&local_70);
  QProcess::start(&local_28,&local_40,&local_58,3);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  cVar1 = QProcess::waitForStarted((int)&local_28);
  if (cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = QProcess::waitForFinished((int)&local_28);
  }
  QProcess::~QProcess((QProcess *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QBenchmarkValgrindUtils::haveValgrind()
{
#ifdef NVALGRIND
    return false;
#else
    QProcess process;
    process.start(u"valgrind"_s, QStringList(u"--version"_s));
    return process.waitForStarted() && process.waitForFinished(-1);
#endif
}